

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

bool __thiscall r_exec::SGMonitor::reduce(SGMonitor *this,_Fact *input)

{
  MDLController *pMVar1;
  bool success;
  short sVar2;
  int iVar3;
  MatchResult MVar4;
  Fact *pFVar5;
  ulong uVar6;
  Pred *this_00;
  Controller *root;
  Sim *sim_00;
  undefined4 extraout_var;
  _Fact *this_01;
  Goal *affected_goal_00;
  Goal *affected_goal;
  _Fact *f_success;
  Code *outcome;
  Sim *sim;
  Pred *prediction;
  _Fact *_input;
  _Fact *input_local;
  SGMonitor *this_local;
  long *plVar7;
  
  pFVar5 = core::P<r_exec::Fact>::operator->(&(this->super__GMonitor).super_Monitor.target);
  uVar6 = (**(code **)((long)(pFVar5->super__Fact).super_LObject.
                             super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code
                             .super__Object._vptr__Object + 0x70))();
  if ((uVar6 & 1) == 0) {
    this_00 = _Fact::get_pred(input);
    prediction = (Pred *)input;
    if (this_00 != (Pred *)0x0) {
      prediction = (Pred *)Pred::get_target(this_00);
      root = core::P::operator_cast_to_Controller_
                       ((P *)&(this->super__GMonitor).super_Monitor.target);
      sim_00 = Pred::get_simulation(this_00,root);
      if (sim_00 != (Sim *)0x0) {
        iVar3 = (*(prediction->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                  super_LObject.super_Code.super__Object._vptr__Object[9])(prediction,0);
        plVar7 = (long *)CONCAT44(extraout_var,iVar3);
        (**(code **)(*plVar7 + 0x20))(plVar7,0);
        sVar2 = r_code::Atom::asOpcode();
        if (sVar2 == Opcodes::Success) {
          this_01 = (_Fact *)(**(code **)(*plVar7 + 0x48))(plVar7,1);
          affected_goal_00 = _Fact::get_goal(this_01);
          if (affected_goal_00 != (Goal *)0x0) {
            success = _Fact::is_fact((_Fact *)prediction);
            _GMonitor::store_simulated_outcome
                      (&this->super__GMonitor,affected_goal_00,sim_00,success);
            return false;
          }
        }
      }
    }
    MVar4 = _Fact::is_evidence((_Fact *)prediction,(this->super__GMonitor).goal_target);
    if (MVar4 == MATCH_SUCCESS_POSITIVE) {
      pMVar1 = (this->super__GMonitor).super_Monitor.controller;
      pFVar5 = core::P::operator_cast_to_Fact_((P *)&(this->super__GMonitor).super_Monitor.target);
      (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [0x10])(pMVar1,pFVar5,1,prediction);
      this_local._7_1_ = false;
    }
    else if (MVar4 == MATCH_SUCCESS_NEGATIVE) {
      pMVar1 = (this->super__GMonitor).super_Monitor.controller;
      pFVar5 = core::P::operator_cast_to_Fact_((P *)&(this->super__GMonitor).super_Monitor.target);
      (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [0x10])(pMVar1,pFVar5,0,prediction);
      this_local._7_1_ = false;
    }
    else if (MVar4 == MATCH_FAILURE) {
      this_local._7_1_ = false;
    }
    else {
      std::operator<<((ostream *)&std::cerr,"reached invalid state!");
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SGMonitor::reduce(_Fact *input)
{
    if (target->is_invalidated()) {
        return true;
    }

    _Fact *_input;
    Pred *prediction = input->get_pred();

    if (prediction) { // input is f0->pred->f1->object.
        _input = prediction->get_target(); // _input is f1->obj.
        Sim *sim = prediction->get_simulation(target);

        if (sim) {
            Code *outcome = _input->get_reference(0);

            if (outcome->code(0).asOpcode() == Opcodes::Success) { // _input is f1->success or |f1->success.
                _Fact *f_success = (_Fact *)outcome->get_reference(SUCCESS_OBJ);
                Goal *affected_goal = f_success->get_goal();

                if (affected_goal) {
                    store_simulated_outcome(affected_goal, sim, _input->is_fact());
                    return false;
                }
            }
        }
    } else {
        _input = input;
    }

    // Non-simulated input (can be actual or predicted): report the simulated outcome: this will inject a simulated prediction of the outcome, to allow any g-monitor deciding on this ground.
    switch (_input->is_evidence(goal_target)) {
    case MATCH_SUCCESS_POSITIVE:
        ((PMDLController *)controller)->register_simulated_goal_outcome(target, true, _input); // report a simulated success.
        return false;

    case MATCH_SUCCESS_NEGATIVE:
        ((PMDLController *)controller)->register_simulated_goal_outcome(target, false, _input); // report a simulated failure.
        return false;

    case MATCH_FAILURE:
        return false;
    }

    std::cerr << "reached invalid state!";
    return false;
}